

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cose.cpp
# Opt level: O1

Error * ot::commissioner::cose::MakeCoseKey
                  (Error *__return_storage_ptr__,ByteArray *aEncodedCoseKey,mbedtls_pk_context *aKey
                  ,ByteArray *aKeyId)

{
  string *this;
  ErrorCode EVar1;
  uint8_t *aBytes;
  uint8_t *puVar2;
  _Alloc_hider _Var3;
  char *pcVar4;
  int iVar5;
  mbedtls_pk_type_t mVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  size_t sVar8;
  char *from;
  char *to;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar9;
  string_view fmt;
  format_args args;
  format_args args_00;
  CborMap coseKey;
  size_t encodedCoseKeyLength;
  writer write;
  uint8_t yPoint [65];
  uint8_t xPoint [65];
  uint8_t encodedCoseKey [1024];
  undefined1 local_588 [8];
  _Alloc_hider _Stack_580;
  size_t local_578;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_570;
  parse_func local_560 [1];
  CborValue local_558;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_540;
  size_t local_538;
  undefined1 local_530 [8];
  char *local_528;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_520;
  string local_508;
  writer local_4e0;
  uchar local_4d8 [65];
  uint8_t auStack_497 [15];
  uchar local_488 [65];
  uint8_t auStack_447 [15];
  uint8_t local_438 [1032];
  
  __return_storage_ptr__->mCode = kNone;
  this = &__return_storage_ptr__->mMessage;
  local_540 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_540;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  CborValue::CborValue(&local_558);
  local_558._vptr_CborValue = (_func_int **)&PTR__CborValue_002b9e88;
  iVar5 = mbedtls_pk_can_do(aKey,MBEDTLS_PK_ECDSA);
  if (iVar5 != 0) {
    local_578 = *(size_t *)&aKey->priv_id;
    local_588 = (undefined1  [8])aKey->pk_info;
    _Stack_580._M_p = (pointer)aKey->pk_ctx;
    mVar6 = mbedtls_pk_get_type((mbedtls_pk_context *)local_588);
    _Var3._M_p = _Stack_580._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Stack_580._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0 && 0xfffffffc < mVar6 - MBEDTLS_PK_RSA_ALT) {
      CborMap::Init((Error *)local_588,(CborMap *)&local_558);
      __return_storage_ptr__->mCode = local_588._0_4_;
      std::__cxx11::string::operator=((string *)this,(string *)&_Stack_580);
      EVar1 = __return_storage_ptr__->mCode;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Stack_580._M_p != &local_570) {
        operator_delete(_Stack_580._M_p);
      }
      if (EVar1 != kNone) {
        return __return_storage_ptr__;
      }
      aBytes = (aKeyId->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar2 = (aKeyId->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (aBytes != puVar2) {
        CborMap::Put((Error *)local_588,(CborMap *)&local_558,2,aBytes,(long)puVar2 - (long)aBytes);
        __return_storage_ptr__->mCode = local_588._0_4_;
        std::__cxx11::string::operator=((string *)this,(string *)&_Stack_580);
        EVar1 = __return_storage_ptr__->mCode;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Stack_580._M_p != &local_570) {
          operator_delete(_Stack_580._M_p);
        }
        if (EVar1 != kNone) {
          return __return_storage_ptr__;
        }
      }
      CborMap::Put((Error *)local_588,(CborMap *)&local_558,1,2);
      __return_storage_ptr__->mCode = local_588._0_4_;
      std::__cxx11::string::operator=((string *)this,(string *)&_Stack_580);
      EVar1 = __return_storage_ptr__->mCode;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Stack_580._M_p != &local_570) {
        operator_delete(_Stack_580._M_p);
      }
      if (EVar1 != kNone) {
        return __return_storage_ptr__;
      }
      if (*(uint *)_Var3._M_p - 3 < 3) {
        CborMap::Put((Error *)local_588,(CborMap *)&local_558,-1,*(uint *)_Var3._M_p - 2);
        __return_storage_ptr__->mCode = local_588._0_4_;
        std::__cxx11::string::operator=((string *)this,(string *)&_Stack_580);
        EVar1 = __return_storage_ptr__->mCode;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Stack_580._M_p != &local_570) {
          operator_delete(_Stack_580._M_p);
        }
        if (EVar1 != kNone) {
          return __return_storage_ptr__;
        }
        iVar5 = mbedtls_mpi_write_binary((mbedtls_mpi *)(_Var3._M_p + 0xd0),local_488,0x41);
        if (iVar5 != 0) {
          ErrorFromMbedtlsError((Error *)local_588,iVar5);
          __return_storage_ptr__->mCode = local_588._0_4_;
          std::__cxx11::string::operator=((string *)this,(string *)&_Stack_580);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Stack_580._M_p != &local_570) {
            operator_delete(_Stack_580._M_p);
          }
          if (iVar5 != 0) {
            return __return_storage_ptr__;
          }
        }
        sVar8 = mbedtls_mpi_size((mbedtls_mpi *)(_Var3._M_p + 0xd0));
        CborMap::Put((Error *)local_588,(CborMap *)&local_558,-2,auStack_447 + -sVar8,sVar8);
        __return_storage_ptr__->mCode = local_588._0_4_;
        std::__cxx11::string::operator=((string *)this,(string *)&_Stack_580);
        EVar1 = __return_storage_ptr__->mCode;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Stack_580._M_p != &local_570) {
          operator_delete(_Stack_580._M_p);
        }
        if (EVar1 != kNone) {
          return __return_storage_ptr__;
        }
        iVar5 = mbedtls_mpi_write_binary((mbedtls_mpi *)(_Var3._M_p + 0xe0),local_4d8,0x41);
        if (iVar5 != 0) {
          ErrorFromMbedtlsError((Error *)local_588,iVar5);
          __return_storage_ptr__->mCode = local_588._0_4_;
          std::__cxx11::string::operator=((string *)this,(string *)&_Stack_580);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Stack_580._M_p != &local_570) {
            operator_delete(_Stack_580._M_p);
          }
          if (iVar5 != 0) {
            return __return_storage_ptr__;
          }
        }
        sVar8 = mbedtls_mpi_size((mbedtls_mpi *)(_Var3._M_p + 0xe0));
        CborMap::Put((Error *)local_588,(CborMap *)&local_558,-3,auStack_497 + -sVar8,sVar8);
        __return_storage_ptr__->mCode = local_588._0_4_;
        std::__cxx11::string::operator=((string *)this,(string *)&_Stack_580);
        EVar1 = __return_storage_ptr__->mCode;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Stack_580._M_p != &local_570) {
          operator_delete(_Stack_580._M_p);
        }
        if (EVar1 != kNone) {
          return __return_storage_ptr__;
        }
        CborValue::Serialize((Error *)local_588,&local_558,local_438,&local_538,0x400);
        __return_storage_ptr__->mCode = local_588._0_4_;
        std::__cxx11::string::operator=((string *)this,(string *)&_Stack_580);
        EVar1 = __return_storage_ptr__->mCode;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Stack_580._M_p != &local_570) {
          operator_delete(_Stack_580._M_p);
        }
        if (EVar1 != kNone) {
          return __return_storage_ptr__;
        }
        std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char*>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)aEncodedCoseKey,local_438,
                   local_438 + local_538);
        return __return_storage_ptr__;
      }
      ::fmt::v10::detail::check_format_string<int,_FMT_COMPILE_STRING,_0>();
      local_508._M_dataplus._M_p = (pointer)(ulong)*(uint *)_Var3._M_p;
      fmt.size_ = 1;
      fmt.data_ = (char *)0x30;
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)&local_508;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)local_530,(v10 *)"make COSE key with invalid EC2 curve group ID {}",fmt,
                 args_00);
      local_588._0_4_ = 2;
      _Stack_580._M_p = (pointer)&local_570;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&_Stack_580,CONCAT44(local_530._4_4_,local_530._0_4_),
                 local_528 + CONCAT44(local_530._4_4_,local_530._0_4_));
      __return_storage_ptr__->mCode = local_588._0_4_;
      std::__cxx11::string::operator=((string *)this,(string *)&_Stack_580);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Stack_580._M_p != &local_570) {
        operator_delete(_Stack_580._M_p);
      }
      paVar7 = &local_520;
      goto LAB_00200bba;
    }
  }
  local_588 = (undefined1  [8])((ulong)local_588 & 0xffffffff00000000);
  from = "Make COSE key without valid EC key";
  _Stack_580._M_p = "Make COSE key without valid EC key";
  local_578 = 0x22;
  local_570._M_allocated_capacity = 0;
  local_560[0] = (parse_func)0x0;
  local_570._8_8_ =
       (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)local_588;
  local_4e0.handler_ =
       (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)local_588;
  do {
    if (from == "") break;
    to = from;
    if (*from == '{') {
LAB_00200b05:
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&local_4e0,from,to);
      from = ::fmt::v10::detail::
             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                       (to,"",(format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_588);
      bVar9 = true;
    }
    else {
      to = from + 1;
      bVar9 = to != "";
      if (bVar9) {
        if (*to != '{') {
          pcVar4 = from + 2;
          do {
            to = pcVar4;
            bVar9 = to != "";
            if (to == "") goto LAB_00200b01;
            pcVar4 = to + 1;
          } while (*to != '{');
        }
        bVar9 = true;
      }
LAB_00200b01:
      if (bVar9) goto LAB_00200b05;
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&local_4e0,from,"");
      bVar9 = false;
    }
  } while (bVar9);
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)local_588;
  ::fmt::v10::vformat_abi_cxx11_
            (&local_508,(v10 *)"Make COSE key without valid EC key",(string_view)ZEXT816(0x22),args)
  ;
  local_530._0_4_ = kInvalidArgs;
  local_528 = local_520._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_528,local_508._M_dataplus._M_p,
             local_508._M_dataplus._M_p + local_508._M_string_length);
  __return_storage_ptr__->mCode = local_530._0_4_;
  std::__cxx11::string::operator=((string *)this,(string *)&local_528);
  if (local_528 != local_520._M_local_buf + 8) {
    operator_delete(local_528);
  }
  paVar7 = &local_508.field_2;
LAB_00200bba:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*(undefined1 **)(paVar7->_M_local_buf + -0x10) != paVar7) {
    operator_delete(*(undefined1 **)(paVar7->_M_local_buf + -0x10));
  }
  return __return_storage_ptr__;
}

Assistant:

Error MakeCoseKey(ByteArray &aEncodedCoseKey, const mbedtls_pk_context &aKey, const ByteArray &aKeyId)
{
    static constexpr size_t kMaxCoseKeyLength = 1024;

    Error                             error;
    const struct mbedtls_ecp_keypair *eckey;
    CborMap                           coseKey;
    int                               ec2Curve;
    uint8_t                           xPoint[MBEDTLS_ECP_MAX_PT_LEN];
    size_t                            xLength;
    uint8_t                           yPoint[MBEDTLS_ECP_MAX_PT_LEN];
    size_t                            yLength;
    uint8_t                           encodedCoseKey[kMaxCoseKeyLength];
    size_t                            encodedCoseKeyLength;

    if (!mbedtls_pk_can_do(&aKey, MBEDTLS_PK_ECDSA) || (eckey = mbedtls_pk_ec(aKey)) == nullptr)
    {
        ExitNow(error = ERROR_INVALID_ARGS("Make COSE key without valid EC key"));
    }

    SuccessOrExit(error = coseKey.Init());

    // Cose key id('kid')
    if (!aKeyId.empty())
    {
        SuccessOrExit(error = coseKey.Put(kKeyId, aKeyId.data(), aKeyId.size()));
    }

    // Cose key type
    SuccessOrExit(error = coseKey.Put(kKeyType, kKeyTypeEC2));

    // Cose key EC2 curve
    switch (eckey->grp.id)
    {
    case MBEDTLS_ECP_DP_SECP256R1:
        ec2Curve = kKeyEC2CurveP256;
        break;
    case MBEDTLS_ECP_DP_SECP384R1:
        ec2Curve = kKeyEC2CurveP384;
        break;
    case MBEDTLS_ECP_DP_SECP521R1:
        ec2Curve = kKeyEC2CurveP521;
        break;
    default:
        ExitNow(error = ERROR_INVALID_ARGS("make COSE key with invalid EC2 curve group ID {}",
                                           static_cast<int>(eckey->grp.id)));
    }
    SuccessOrExit(error = coseKey.Put(kKeyEC2Curve, ec2Curve));

    // Cose key EC2 X
    if (int fail = mbedtls_mpi_write_binary(&eckey->Q.X, xPoint, sizeof(xPoint)))
    {
        ExitNow(error = ErrorFromMbedtlsError(fail));
    }

    // 'mbedtls_mpi_write_binary' writes to the end of buffer
    xLength = mbedtls_mpi_size(&eckey->Q.X);
    SuccessOrExit(error = coseKey.Put(kKeyEC2X, xPoint + sizeof(xPoint) - xLength, xLength));

    // TODO(wgtdkp): handle the situation that Y point is not presented.
    // Cose key EC2 Y
    if (int fail = mbedtls_mpi_write_binary(&eckey->Q.Y, yPoint, sizeof(yPoint)))
    {
        ExitNow(error = ErrorFromMbedtlsError(fail));
    }

    yLength = mbedtls_mpi_size(&eckey->Q.Y);
    SuccessOrExit(error = coseKey.Put(kKeyEC2Y, yPoint + sizeof(yPoint) - yLength, yLength));

    SuccessOrExit(error = coseKey.Serialize(encodedCoseKey, encodedCoseKeyLength, sizeof(encodedCoseKey)));

    aEncodedCoseKey.assign(encodedCoseKey, encodedCoseKey + encodedCoseKeyLength);

exit:
    return error;
}